

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec.c
# Opt level: O2

axbStatus_t axbVecScale(axbVec_s *x,axbScalar_s *alpha)

{
  axbOpDescriptor_t *paVar1;
  axbStatus_t aVar2;
  
  if (x->init == 0x1d232) {
    paVar1 = x->opBackend->op_table;
    (*paVar1[3].func)(x,alpha,paVar1[3].func_data);
    aVar2 = 0;
  }
  else {
    fwrite("Vector not fully initialized!\n",0x1e,1,_stderr);
    aVar2 = 0x1d232;
  }
  return aVar2;
}

Assistant:

axbStatus_t axbVecScale(struct axbVec_s *x, const struct axbScalar_s *alpha)
{
  AXB_VECTOR_INIT_CHECK(x);

  axbOpDescriptor_t op_desc = x->opBackend->op_table[AXB_OP_VEC_SCALE];
  axbStatus_t (*op)(struct axbVec_s *, const struct axbScalar_s *, void*) = (axbStatus_t (*)(struct axbVec_s *, const struct axbScalar_s *, void*)) op_desc.func;
  op(x, alpha, op_desc.func_data);
  return 0;
}